

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

void ossl_free_multi_ssl_backend_data(multi_ssl_backend_data *mbackend)

{
  if ((X509_STORE *)mbackend->store != (X509_STORE *)0x0) {
    X509_STORE_free((X509_STORE *)mbackend->store);
  }
  (*Curl_cfree)(mbackend->CAfile);
  (*Curl_cfree)(mbackend);
  return;
}

Assistant:

static void ossl_free_multi_ssl_backend_data(
  struct multi_ssl_backend_data *mbackend)
{
#if defined(HAVE_SSL_X509_STORE_SHARE)
  if(mbackend->store) {
    X509_STORE_free(mbackend->store);
  }
  free(mbackend->CAfile);
  free(mbackend);
#else /* HAVE_SSL_X509_STORE_SHARE */
  (void)mbackend;
#endif /* HAVE_SSL_X509_STORE_SHARE */
}